

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O2

REF_STATUS ref_layer_recon(REF_LAYER ref_layer,REF_GRID ref_grid)

{
  REF_NODE pRVar1;
  REF_CELL ref_cell;
  REF_STATUS RVar2;
  uint uVar3;
  long lVar4;
  int cell;
  long lVar5;
  char *__s;
  REF_BOOL has_side;
  REF_LAYER local_b8;
  REF_CELL local_b0;
  REF_INT nodes [27];
  
  local_b0 = ref_grid->cell[8];
  pRVar1 = ref_layer->ref_grid->node;
  ref_cell = ref_layer->ref_grid->cell[0];
  cell = 0;
  local_b8 = ref_layer;
  do {
    if (ref_cell->max <= cell) {
      return 0;
    }
    RVar2 = ref_cell_nodes(ref_cell,cell,nodes);
    if (RVar2 == 0) {
      lVar5 = 0xffffffff;
      if ((-1 < (long)nodes[0]) && (lVar5 = 0xffffffff, nodes[0] < pRVar1->max)) {
        lVar5 = pRVar1->global[nodes[0]];
        if (pRVar1->global[nodes[0]] < 0) {
          lVar5 = -1;
        }
      }
      lVar4 = 0xffffffff;
      if ((-1 < (long)nodes[1]) && (lVar4 = 0xffffffff, nodes[1] < pRVar1->max)) {
        lVar4 = pRVar1->global[nodes[1]];
        if (pRVar1->global[nodes[1]] < 0) {
          lVar4 = -1;
        }
      }
      uVar3 = ref_cell_has_side(local_b0,(REF_INT)lVar5,(REF_INT)lVar4,&has_side);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x156,"ref_layer_recon",(ulong)uVar3,"side?");
        return uVar3;
      }
      if (local_b8->verbose != 0) {
        __s = "got one";
        if (has_side == 0) {
          __s = "need one";
        }
        puts(__s);
      }
    }
    cell = cell + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_layer_recon(REF_LAYER ref_layer, REF_GRID ref_grid) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_NODE layer_node = ref_grid_node(ref_layer_grid(ref_layer));
  REF_CELL layer_edge = ref_grid_edg(ref_layer_grid(ref_layer));
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL has_side;
  REF_INT node0, node1;

  each_ref_cell_valid_cell_with_nodes(layer_edge, cell, nodes) {
    node0 = (REF_INT)ref_node_global(layer_node, nodes[0]);
    node1 = (REF_INT)ref_node_global(layer_node, nodes[1]);
    RSS(ref_cell_has_side(ref_cell, node0, node1, &has_side), "side?");
    if (has_side) {
      if (ref_layer->verbose) printf("got one\n");
    } else {
      if (ref_layer->verbose) printf("need one\n");
    }
  }

  return REF_SUCCESS;
}